

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

Bit16u MT32Emu::LA32Utilites::interpolateExp(Bit16u fract)

{
  ushort uVar1;
  ushort uVar2;
  Tables *pTVar3;
  Bit16u expTabEntry1;
  Bit16u expTabEntry2;
  Bit16u extraBits;
  Bit16u expTabIndex;
  Bit16u fract_local;
  
  uVar1 = (ushort)((int)(uint)fract >> 3);
  pTVar3 = Tables::getInstance();
  uVar2 = 0x1fff - pTVar3->exp9[uVar1];
  if (uVar1 == 0) {
    uVar1 = 0x1fff;
  }
  else {
    pTVar3 = Tables::getInstance();
    uVar1 = 0x1fff - pTVar3->exp9[((int)(uint)fract >> 3) + -1];
  }
  return uVar2 + (short)((int)(((uint)uVar1 - (uint)uVar2) * (uint)((fract ^ 0xffff) & 7)) >> 3);
}

Assistant:

Bit16u LA32Utilites::interpolateExp(const Bit16u fract) {
	Bit16u expTabIndex = fract >> 3;
	Bit16u extraBits = ~fract & 7;
	Bit16u expTabEntry2 = 8191 - Tables::getInstance().exp9[expTabIndex];
	Bit16u expTabEntry1 = expTabIndex == 0 ? 8191 : (8191 - Tables::getInstance().exp9[expTabIndex - 1]);
	return expTabEntry2 + (((expTabEntry1 - expTabEntry2) * extraBits) >> 3);
}